

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O0

size_t fiobj_str_capa_assert(FIOBJ str,size_t size)

{
  size_t sVar1;
  undefined1 local_38 [8];
  fio_str_info_s state;
  size_t size_local;
  FIOBJ str_local;
  
  state.data = (char *)size;
  sVar1 = fiobj_type_is(str,FIOBJ_T_STRING);
  if (sVar1 != 0) {
    if (*(char *)((str & 0xfffffffffffffff8) + 0x11) == '\0') {
      fio_str_capa_assert((fio_str_info_s *)local_38,
                          (fio_str_s_conflict *)((str & 0xfffffffffffffff8) + 0x10),
                          (size_t)state.data);
      str_local = (FIOBJ)local_38;
    }
    else {
      str_local = 0;
    }
    return str_local;
  }
  __assert_fail("FIOBJ_TYPE_IS(str, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_str.c"
                ,0xce,"size_t fiobj_str_capa_assert(FIOBJ, size_t)");
}

Assistant:

size_t fiobj_str_capa_assert(FIOBJ str, size_t size) {

  assert(FIOBJ_TYPE_IS(str, FIOBJ_T_STRING));
  if (obj2str(str)->str.frozen)
    return 0;
  fio_str_info_s state = fio_str_capa_assert(&obj2str(str)->str, size);
  return state.capa;
}